

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

object __thiscall
pybind11::detail::
object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::operator()
          (object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>
           *this,object *args,str *args_1)

{
  PyObject *in_RCX;
  simple_collector<(pybind11::return_value_policy)1> *in_RDX;
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_> *in_RSI;
  handle in_RDI;
  
  collect_arguments<(pybind11::return_value_policy)1,pybind11::object&,pybind11::str,void>
            ((object *)in_RSI,(str *)in_RDI.m_ptr);
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>::derived
            (in_RSI);
  accessor<pybind11::detail::accessor_policies::str_attr>::ptr
            ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x3a0ac4);
  simple_collector<(pybind11::return_value_policy)1>::call(in_RDX,in_RCX);
  simple_collector<(pybind11::return_value_policy)1>::~simple_collector
            ((simple_collector<(pybind11::return_value_policy)1> *)0x3a0aea);
  return (object)(handle)in_RDI.m_ptr;
}

Assistant:

object object_api<Derived>::operator()(Args &&...args) const {
    return detail::collect_arguments<policy>(std::forward<Args>(args)...).call(derived().ptr());
}